

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idasFoodWeb_bnd.c
# Opt level: O2

int main(void)

{
  ulong uVar1;
  sunrealtype *psVar2;
  sunrealtype *psVar3;
  int iVar4;
  UserData webdata;
  N_Vector p_Var5;
  sunrealtype **ppsVar6;
  N_Vector crate;
  void *pvVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  void *returnvalue;
  long lVar11;
  int iVar12;
  uint uVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  double dVar17;
  int retval;
  SUNContext ctx;
  double local_a8;
  void *local_a0;
  void *local_98;
  void *local_90;
  sunrealtype tret;
  void *local_80;
  long ncfn;
  long netf;
  long nje;
  long nnf;
  long nni;
  long nre;
  long nst;
  undefined4 local_3c;
  long nreLS;
  
  retval = SUNContext_Create(0,&ctx);
  iVar12 = 1;
  iVar4 = check_retval(&retval,"SUNContext_Create",1);
  if (iVar4 == 0) {
    webdata = (UserData)malloc(0x78);
    p_Var5 = (N_Vector)N_VNew_Serial(800,ctx);
    webdata->rates = p_Var5;
    ppsVar6 = (sunrealtype **)SUNDlsMat_newDenseMat(2,2);
    webdata->acoef = ppsVar6;
    webdata->mx = 0x14;
    webdata->my = 0x14;
    webdata->ns = 2;
    webdata->np = 1;
    webdata->dx = 0.05263157894736842;
    webdata->dy = 0.05263157894736842;
    webdata->Neq = 800;
    psVar2 = *ppsVar6;
    psVar3 = ppsVar6[1];
    psVar2[1] = -5e-07;
    *psVar3 = 10000.0;
    *psVar2 = -1.0;
    psVar3[1] = -1.0;
    webdata->bcoef[0] = 1.0;
    webdata->bcoef[1] = -1.0;
    *(undefined4 *)webdata->cox = 1;
    *(undefined4 *)((long)webdata->cox + 4) = 0x40769000;
    *(undefined4 *)(webdata->cox + 1) = 0xccccccce;
    *(undefined4 *)((long)webdata->cox + 0xc) = 0x40320ccc;
    *(undefined4 *)webdata->coy = 1;
    *(undefined4 *)((long)webdata->coy + 4) = 0x40769000;
    *(undefined4 *)(webdata->coy + 1) = 0xccccccce;
    *(undefined4 *)((long)webdata->coy + 0xc) = 0x40320ccc;
    p_Var5 = (N_Vector)N_VNew_Serial(800,ctx);
    iVar4 = check_retval(p_Var5,"N_VNew_Serial",0);
    if (iVar4 == 0) {
      crate = (N_Vector)N_VClone(p_Var5);
      iVar4 = check_retval(crate,"N_VNew_Serial",0);
      if (iVar4 == 0) {
        pvVar7 = (void *)N_VClone(p_Var5);
        iVar4 = check_retval(pvVar7,"N_VNew_Serial",0);
        if (iVar4 == 0) {
          lVar8 = N_VGetArrayPointer(p_Var5);
          lVar9 = N_VGetArrayPointer(crate);
          local_90 = pvVar7;
          lVar10 = N_VGetArrayPointer();
          for (lVar11 = 0; lVar11 != 0x14; lVar11 = lVar11 + 1) {
            for (lVar14 = 0; lVar14 != 0x14; lVar14 = lVar14 + 1) {
              dVar17 = (double)lVar14 * 0.05263157894736842 * 16.0 *
                       (1.0 - (double)lVar14 * 0.05263157894736842) *
                       (double)lVar11 * 0.05263157894736842 *
                       (1.0 - (double)lVar11 * 0.05263157894736842);
              uVar1 = lVar11 * 0x28 + lVar14 * 2;
              uVar15 = 0;
              while (uVar15 != 2) {
                if ((long)uVar15 < 1) {
                  uVar16 = uVar15 | uVar1;
                  *(double *)(lVar8 + uVar16 * 8) =
                       (double)(long)(uVar15 + 1) * dVar17 * dVar17 + 10.0;
                  *(undefined8 *)(lVar10 + uVar16 * 8) = 0x3ff0000000000000;
                  uVar15 = uVar15 + 1;
                }
                else {
                  uVar16 = uVar15 | uVar1;
                  *(undefined8 *)(lVar8 + uVar16 * 8) = 0x40f86a0000000000;
                  *(undefined8 *)(lVar10 + uVar16 * 8) = 0;
                  uVar15 = uVar15 + 1;
                }
              }
            }
          }
          Fweb(0.05263157894736842,p_Var5,crate,webdata);
          for (lVar8 = 0; lVar10 = 8, lVar8 != 0x14; lVar8 = lVar8 + 1) {
            for (; lVar10 != 0x148; lVar10 = lVar10 + 0x10) {
              *(undefined8 *)(lVar9 + lVar10) = 0;
            }
            lVar9 = lVar9 + 0x140;
          }
          pvVar7 = (void *)IDACreate(ctx);
          local_80 = pvVar7;
          iVar4 = check_retval(pvVar7,"IDACreate",0);
          if (iVar4 == 0) {
            retval = IDASetUserData(pvVar7,webdata);
            iVar12 = 1;
            iVar4 = check_retval(&retval,"IDASetUserData",1);
            if (iVar4 == 0) {
              retval = IDASetId(pvVar7,local_90);
              iVar12 = 1;
              iVar4 = check_retval(&retval,"IDASetId",1);
              if (iVar4 == 0) {
                retval = IDAInit(0,pvVar7,resweb,p_Var5,crate);
                iVar12 = 1;
                iVar4 = check_retval(&retval,"IDAInit",1);
                if (iVar4 == 0) {
                  retval = IDASStolerances(0x88e368f1,0x3ee4f8b588e368f1,pvVar7);
                  iVar12 = 1;
                  iVar4 = check_retval(&retval,"IDASStolerances",1);
                  if (iVar4 == 0) {
                    returnvalue = (void *)SUNBandMatrix(800,0x28,0x28,ctx);
                    iVar4 = check_retval(returnvalue,"SUNBandMatrix",0);
                    if (iVar4 == 0) {
                      local_98 = returnvalue;
                      local_a0 = (void *)SUNLinSol_Band(p_Var5,returnvalue,ctx);
                      iVar4 = check_retval(local_a0,"SUNLinSol_Band",0);
                      if (iVar4 == 0) {
                        retval = IDASetLinearSolver(pvVar7,local_a0,local_98);
                        iVar12 = 1;
                        iVar4 = check_retval(&retval,"IDASetLinearSolver",1);
                        if (iVar4 == 0) {
                          iVar12 = 1;
                          local_a8 = 0.001;
                          retval = IDACalcIC(pvVar7,1);
                          iVar4 = check_retval(&retval,"IDACalcIC",1);
                          if (iVar4 == 0) {
                            puts(
                                "\nidasFoodWeb_bnd: Predator-prey DAE serial example problem for IDA \n"
                                );
                            printf("Number of species ns: %d",2);
                            printf("     Mesh dimensions: %d x %d",0x14);
                            printf("     System size: %d\n",800);
                            printf("Tolerance parameters:  rtol = %g   atol = %g\n",0x88e368f1,
                                   0x3ee4f8b588e368f1);
                            printf("Linear solver: BAND,  Band parameters mu = %ld, ml = %ld\n",0x28
                                  );
                            puts("CalcIC called to correct initial predator concentrations.\n");
                            puts("-----------------------------------------------------------");
                            printf("  t        bottom-left  top-right");
                            puts("    | nst  k      h");
                            puts("-----------------------------------------------------------\n");
                            PrintOutput(pvVar7,p_Var5,0.0);
                            for (uVar13 = 1; uVar13 != 7; uVar13 = uVar13 + 1) {
                              retval = IDASolve(SUB84(local_a8,0),pvVar7,&tret,p_Var5,crate,1);
                              iVar4 = check_retval(&retval,"IDASolve",1);
                              if (iVar4 != 0) {
                                return retval;
                              }
                              PrintOutput(pvVar7,p_Var5,tret);
                              dVar17 = local_a8 + 0.3;
                              local_a8 = local_a8 * 10.0;
                              if (2 < uVar13) {
                                local_a8 = dVar17;
                              }
                            }
                            local_3c = IDAGetNumSteps(pvVar7,&nst);
                            check_retval(&local_3c,"IDAGetNumSteps",1);
                            local_3c = IDAGetNumNonlinSolvIters(pvVar7,&nni);
                            check_retval(&local_3c,"IDAGetNumNonlinSolvIters",1);
                            local_3c = IDAGetNumResEvals(pvVar7,&nre);
                            check_retval(&local_3c,"IDAGetNumResEvals",1);
                            local_3c = IDAGetNumErrTestFails(pvVar7,&netf);
                            check_retval(&local_3c,"IDAGetNumErrTestFails",1);
                            local_3c = IDAGetNumNonlinSolvConvFails(pvVar7,&nnf);
                            check_retval(&local_3c,"IDAGetNumNonlinSolvConvFails",1);
                            local_3c = IDAGetNumStepSolveFails(pvVar7,&ncfn);
                            check_retval(&local_3c,"IDAGetNumStepSolveFails",1);
                            local_3c = IDAGetNumJacEvals(pvVar7,&nje);
                            check_retval(&local_3c,"IDAGetNumJacEvals",1);
                            local_3c = IDAGetNumLinResEvals(pvVar7);
                            check_retval(&local_3c,"IDAGetNumLinResEvals",1);
                            puts("-----------------------------------------------------------");
                            puts("Final run statistics: \n");
                            iVar12 = 0;
                            printf("Number of steps                    = %ld\n",nst);
                            printf("Number of residual evaluations     = %ld\n",nreLS + nre);
                            printf("Number of Jacobian evaluations     = %ld\n",nje);
                            printf("Number of nonlinear iterations     = %ld\n",nni);
                            printf("Number of error test failures      = %ld\n",netf);
                            printf("Number of nonlinear conv. failures = %ld\n",nnf);
                            printf("Number of step solver failures     = %ld\n",ncfn);
                            IDAFree(&local_80);
                            SUNLinSolFree(local_a0);
                            SUNMatDestroy(local_98);
                            N_VDestroy(p_Var5);
                            N_VDestroy(crate);
                            N_VDestroy(local_90);
                            SUNDlsMat_destroyMat(webdata->acoef);
                            N_VDestroy(webdata->rates);
                            free(webdata);
                            SUNContext_Free(&ctx);
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return iVar12;
}

Assistant:

int main(void)
{
  void* mem;
  UserData webdata;
  N_Vector cc, cp, id;
  int iout, retval;
  sunindextype mu, ml;
  sunrealtype rtol, atol, t0, tout, tret;
  SUNMatrix A;
  SUNLinearSolver LS;
  SUNContext ctx;

  mem     = NULL;
  webdata = NULL;
  cc = cp = id = NULL;
  A            = NULL;
  LS           = NULL;

  /* Create the SUNDIALS context object for this simulation */
  retval = SUNContext_Create(SUN_COMM_NULL, &ctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return 1; }

  /* Allocate and initialize user data block webdata. */

  webdata        = (UserData)malloc(sizeof *webdata);
  webdata->rates = N_VNew_Serial(NEQ, ctx);
  webdata->acoef = SUNDlsMat_newDenseMat(NUM_SPECIES, NUM_SPECIES);

  InitUserData(webdata);

  /* Allocate N-vectors and initialize cc, cp, and id. */

  cc = N_VNew_Serial(NEQ, ctx);
  if (check_retval((void*)cc, "N_VNew_Serial", 0)) { return (1); }

  cp = N_VClone(cc);
  if (check_retval((void*)cp, "N_VNew_Serial", 0)) { return (1); }

  id = N_VClone(cc);
  if (check_retval((void*)id, "N_VNew_Serial", 0)) { return (1); }

  SetInitialProfiles(cc, cp, id, webdata);

  /* Set remaining inputs to IDAMalloc. */

  t0   = ZERO;
  rtol = RTOL;
  atol = ATOL;

  /* Call IDACreate and IDAMalloc to initialize IDA. */

  mem = IDACreate(ctx);
  if (check_retval((void*)mem, "IDACreate", 0)) { return (1); }

  retval = IDASetUserData(mem, webdata);
  if (check_retval(&retval, "IDASetUserData", 1)) { return (1); }

  retval = IDASetId(mem, id);
  if (check_retval(&retval, "IDASetId", 1)) { return (1); }

  retval = IDAInit(mem, resweb, t0, cc, cp);
  if (check_retval(&retval, "IDAInit", 1)) { return (1); }

  retval = IDASStolerances(mem, rtol, atol);
  if (check_retval(&retval, "IDASStolerances", 1)) { return (1); }

  /* Create banded SUNMatrix for use in linear solves */
  mu = ml = NSMX;
  A       = SUNBandMatrix(NEQ, mu, ml, ctx);
  if (check_retval((void*)A, "SUNBandMatrix", 0)) { return (1); }

  /* Create banded SUNLinearSolver object */
  LS = SUNLinSol_Band(cc, A, ctx);
  if (check_retval((void*)LS, "SUNLinSol_Band", 0)) { return (1); }

  /* Attach the matrix and linear solver */
  retval = IDASetLinearSolver(mem, LS, A);
  if (check_retval(&retval, "IDASetLinearSolver", 1)) { return (1); }

  /* Call IDACalcIC (with default options) to correct the initial values. */

  tout   = SUN_RCONST(0.001);
  retval = IDACalcIC(mem, IDA_YA_YDP_INIT, tout);
  if (check_retval(&retval, "IDACalcIC", 1)) { return (1); }

  /* Print heading, basic parameters, and initial values. */

  PrintHeader(mu, ml, rtol, atol);
  PrintOutput(mem, cc, ZERO);

  /* Loop over iout, call IDASolve (normal mode), print selected output. */

  for (iout = 1; iout <= NOUT; iout++)
  {
    retval = IDASolve(mem, tout, &tret, cc, cp, IDA_NORMAL);
    if (check_retval(&retval, "IDASolve", 1)) { return (retval); }

    PrintOutput(mem, cc, tret);

    if (iout < 3) { tout *= TMULT; }
    else { tout += TADD; }
  }

  /* Print final statistics and free memory. */

  PrintFinalStats(mem);

  /* Free memory */

  IDAFree(&mem);
  SUNLinSolFree(LS);
  SUNMatDestroy(A);

  N_VDestroy(cc);
  N_VDestroy(cp);
  N_VDestroy(id);

  SUNDlsMat_destroyMat(webdata->acoef);
  N_VDestroy(webdata->rates);
  free(webdata);

  SUNContext_Free(&ctx);

  return (0);
}